

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O0

int readMessageIdFromuAQMPMessage
              (IOTHUB_MESSAGE_HANDLE iothub_message_handle,
              PROPERTIES_HANDLE uamqp_message_properties)

{
  int iVar1;
  AMQP_TYPE AVar2;
  IOTHUB_MESSAGE_RESULT IVar3;
  LOGGER_LOG p_Var4;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  uuid uuid_value;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  uint64_t ulong_value;
  LOGGER_LOG l;
  char local_b8 [7];
  _Bool free_string_value;
  char string_buffer [128];
  char *string_value;
  AMQP_VALUE pAStack_28;
  AMQP_TYPE value_type;
  AMQP_VALUE uamqp_message_property;
  PROPERTIES_HANDLE pPStack_18;
  int result;
  PROPERTIES_HANDLE uamqp_message_properties_local;
  IOTHUB_MESSAGE_HANDLE iothub_message_handle_local;
  
  pPStack_18 = uamqp_message_properties;
  uamqp_message_properties_local = (PROPERTIES_HANDLE)iothub_message_handle;
  iVar1 = properties_get_message_id(uamqp_message_properties,&stack0xffffffffffffffd8);
  if ((iVar1 == 0) && (pAStack_28 != (AMQP_VALUE)0x0)) {
    AVar2 = amqpvalue_get_type(pAStack_28);
    if (AVar2 == AMQP_TYPE_NULL) {
      uamqp_message_property._4_4_ = 0;
    }
    else {
      l._7_1_ = 0;
      memset(local_b8,0,0x80);
      if (AVar2 == AMQP_TYPE_STRING) {
        iVar1 = amqpvalue_get_string(pAStack_28,(char **)(string_buffer + 0x78));
        if (iVar1 != 0) {
          ulong_value = (uint64_t)xlogging_get_log_function();
          if ((LOGGER_LOG)ulong_value != (LOGGER_LOG)0x0) {
            (*(code *)ulong_value)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                       ,"readMessageIdFromuAQMPMessage",0x309,1,
                       "Failed to get value of uAMQP message \'message-id\' property (string)");
          }
          string_buffer[0x78] = '\0';
          string_buffer[0x79] = '\0';
          string_buffer[0x7a] = '\0';
          string_buffer[0x7b] = '\0';
          string_buffer[0x7c] = '\0';
          string_buffer[0x7d] = '\0';
          string_buffer[0x7e] = '\0';
          string_buffer[0x7f] = '\0';
        }
      }
      else if (AVar2 == AMQP_TYPE_ULONG) {
        iVar1 = amqpvalue_get_ulong(pAStack_28,(uint64_t *)&l_1);
        if (iVar1 == 0) {
          iVar1 = sprintf(local_b8,"%lu",l_1);
          if (iVar1 < 0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                        ,"readMessageIdFromuAQMPMessage",0x318,1,
                        "Failed converting \'message-id\' (ulong) to string");
            }
            string_buffer[0x78] = '\0';
            string_buffer[0x79] = '\0';
            string_buffer[0x7a] = '\0';
            string_buffer[0x7b] = '\0';
            string_buffer[0x7c] = '\0';
            string_buffer[0x7d] = '\0';
            string_buffer[0x7e] = '\0';
            string_buffer[0x7f] = '\0';
          }
          else {
            string_buffer._120_8_ = local_b8;
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readMessageIdFromuAQMPMessage",0x313,1,
                      "Failed to get value of uAMQP message \'message-id\' property (ulong)");
          }
          string_buffer[0x78] = '\0';
          string_buffer[0x79] = '\0';
          string_buffer[0x7a] = '\0';
          string_buffer[0x7b] = '\0';
          string_buffer[0x7c] = '\0';
          string_buffer[0x7d] = '\0';
          string_buffer[0x7e] = '\0';
          string_buffer[0x7f] = '\0';
        }
      }
      else if (AVar2 == AMQP_TYPE_UUID) {
        iVar1 = amqpvalue_get_uuid(pAStack_28,(uuid *)&l_3);
        if (iVar1 == 0) {
          string_buffer._120_8_ = UUID_to_string((UUID_T *)&l_3);
          if ((char *)string_buffer._120_8_ == (char *)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                        ,"readMessageIdFromuAQMPMessage",0x32b,1,
                        "Failed to get the string representation of \'message-id\' UUID");
            }
            string_buffer[0x78] = '\0';
            string_buffer[0x79] = '\0';
            string_buffer[0x7a] = '\0';
            string_buffer[0x7b] = '\0';
            string_buffer[0x7c] = '\0';
            string_buffer[0x7d] = '\0';
            string_buffer[0x7e] = '\0';
            string_buffer[0x7f] = '\0';
          }
          else {
            l._7_1_ = 1;
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readMessageIdFromuAQMPMessage",0x326,1,
                      "Failed to get value of uAMQP message \'message-id\' property (UUID)");
          }
          string_buffer[0x78] = '\0';
          string_buffer[0x79] = '\0';
          string_buffer[0x7a] = '\0';
          string_buffer[0x7b] = '\0';
          string_buffer[0x7c] = '\0';
          string_buffer[0x7d] = '\0';
          string_buffer[0x7e] = '\0';
          string_buffer[0x7f] = '\0';
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readMessageIdFromuAQMPMessage",0x335,1,"Unrecognized type for message-id (%d)"
                    ,AVar2);
        }
        string_buffer[0x78] = '\0';
        string_buffer[0x79] = '\0';
        string_buffer[0x7a] = '\0';
        string_buffer[0x7b] = '\0';
        string_buffer[0x7c] = '\0';
        string_buffer[0x7d] = '\0';
        string_buffer[0x7e] = '\0';
        string_buffer[0x7f] = '\0';
      }
      if (string_buffer._120_8_ == 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readMessageIdFromuAQMPMessage",0x34d,1,"Unexpected null string for message-id"
                   );
        }
        uamqp_message_property._4_4_ = 0x34e;
      }
      else {
        IVar3 = IoTHubMessage_SetMessageId
                          ((IOTHUB_MESSAGE_HANDLE)uamqp_message_properties_local,
                           (char *)string_buffer._120_8_);
        if (IVar3 == IOTHUB_MESSAGE_OK) {
          uamqp_message_property._4_4_ = 0;
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"readMessageIdFromuAQMPMessage",0x33d,1,
                      "Failed to set IOTHUB_MESSAGE_HANDLE \'message-id\' property.");
          }
          uamqp_message_property._4_4_ = 0x33e;
        }
        if ((l._7_1_ & 1) != 0) {
          free((void *)string_buffer._120_8_);
        }
      }
    }
  }
  else {
    uamqp_message_property._4_4_ = 0;
  }
  return uamqp_message_property._4_4_;
}

Assistant:

static int readMessageIdFromuAQMPMessage(IOTHUB_MESSAGE_HANDLE iothub_message_handle, PROPERTIES_HANDLE uamqp_message_properties)
{
    int result;
    AMQP_VALUE uamqp_message_property;

    if (properties_get_message_id(uamqp_message_properties, &uamqp_message_property) != 0 || uamqp_message_property == NULL)
    {
        result = RESULT_OK;
    }
    else
    {
        AMQP_TYPE value_type = amqpvalue_get_type(uamqp_message_property);

        if (value_type != AMQP_TYPE_NULL)
        {

            char* string_value;
            char string_buffer[MESSAGE_ID_MAX_SIZE];
            bool free_string_value = false;

            memset(string_buffer, 0, MESSAGE_ID_MAX_SIZE);

            if (value_type == AMQP_TYPE_STRING)
            {
                if (amqpvalue_get_string(uamqp_message_property, (const char**)(&string_value)) != 0)
                {
                    LogError("Failed to get value of uAMQP message 'message-id' property (string)");
                    string_value = NULL;
                }
            }
            else if (value_type == AMQP_TYPE_ULONG)
            {
                uint64_t ulong_value;

                if (amqpvalue_get_ulong(uamqp_message_property, &ulong_value) != 0)
                {
                    LogError("Failed to get value of uAMQP message 'message-id' property (ulong)");
                    string_value = NULL;
                }
                else if (sprintf(string_buffer, "%" PRIu64, ulong_value) < 0)
                {
                    LogError("Failed converting 'message-id' (ulong) to string");
                    string_value = NULL;
                }
                else
                {
                    string_value = string_buffer;
                }
            }
            else if (value_type == AMQP_TYPE_UUID)
            {
                uuid uuid_value;

                if (amqpvalue_get_uuid(uamqp_message_property, &uuid_value) != 0)
                {
                    LogError("Failed to get value of uAMQP message 'message-id' property (UUID)");
                    string_value = NULL;
                }
                else if ((string_value = UUID_to_string((const UUID_T*)uuid_value)) == NULL)
                {
                    LogError("Failed to get the string representation of 'message-id' UUID");
                    string_value = NULL;
                }
                else
                {
                    free_string_value = true;
                }
            }
            else
            {
                LogError("Unrecognized type for message-id (%d)", value_type);
                string_value = NULL;
            }

            if (string_value != NULL)
            {
                if (IoTHubMessage_SetMessageId(iothub_message_handle, string_value) != IOTHUB_MESSAGE_OK)
                {
                    LogError("Failed to set IOTHUB_MESSAGE_HANDLE 'message-id' property.");
                    result = MU_FAILURE;
                }
                else
                {
                    result = RESULT_OK;
                }

                if (free_string_value)
                {
                    // Only certain code paths allocate this.
                    free(string_value);
                }
            }
            else
            {
                LogError("Unexpected null string for message-id");
                result = MU_FAILURE;
            }
        }
        else
        {
            result = RESULT_OK;
        }
    }

    return result;
}